

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall
cnn::SimpleSGDTrainer::update
          (SimpleSGDTrainer *this,
          vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *lookup_params,
          vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *params,real scale)

{
  float fVar1;
  pointer ppPVar2;
  Parameters *this_00;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  LookupParameters *this_01;
  pointer pTVar6;
  pointer pTVar7;
  bool bVar8;
  float fVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  byte bVar12;
  byte bVar13;
  uint uVar14;
  Index size;
  _Hash_node_base *p_Var16;
  uint uVar17;
  char *pcVar18;
  Index index;
  ulong uVar19;
  uint uVar20;
  Index index_2;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  pointer ppPVar24;
  undefined8 *puVar25;
  ushort uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  float fVar43;
  int iVar44;
  int iVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ulong uVar15;
  
  fVar43 = Trainer::clip_gradients(&this->super_Trainer);
  ppPVar24 = (params->super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (params->super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar24 != ppPVar2) {
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_00 = *ppPVar24;
      uVar15 = (ulong)(this_00->values).d.nd;
      iVar45 = 1;
      iVar44 = 1;
      if (uVar15 != 0) {
        auVar31 = vpbroadcastq_avx512f();
        uVar19 = 0;
        auVar32 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar33 = vmovdqa64_avx512f(auVar32);
          auVar32 = vpbroadcastq_avx512f();
          auVar34 = vporq_avx512f(auVar32,auVar29);
          auVar32 = vporq_avx512f(auVar32,auVar30);
          uVar10 = vpcmpuq_avx512f(auVar32,auVar31,2);
          bVar12 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar34,auVar31,2);
          bVar13 = (byte)uVar10;
          uVar26 = CONCAT11(bVar13,bVar12);
          auVar32 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar19));
          auVar34._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar32._4_4_;
          auVar34._0_4_ = (uint)(bVar12 & 1) * auVar32._0_4_;
          auVar34._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar32._8_4_;
          auVar34._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar32._12_4_;
          auVar34._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar32._16_4_;
          auVar34._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar32._20_4_;
          auVar34._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar32._24_4_;
          auVar34._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar32._28_4_;
          auVar34._32_4_ = (uint)(bVar13 & 1) * auVar32._32_4_;
          auVar34._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar32._36_4_;
          auVar34._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar32._40_4_;
          auVar34._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar32._44_4_;
          auVar34._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar32._48_4_;
          auVar34._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar32._52_4_;
          auVar34._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar32._56_4_;
          auVar34._60_4_ = (uint)(bVar13 >> 7) * auVar32._60_4_;
          auVar32 = vpmulld_avx512f(auVar34,auVar33);
          uVar19 = uVar19 + 0x10;
        } while ((uVar15 + 0xf & 0x1fffffff0) != uVar19);
        auVar31 = vmovdqa32_avx512f(auVar32);
        auVar32._0_4_ =
             (uint)(bVar12 & 1) * auVar31._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar33._0_4_;
        bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar32._4_4_ = (uint)bVar8 * auVar31._4_4_ | (uint)!bVar8 * auVar33._4_4_;
        bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar32._8_4_ = (uint)bVar8 * auVar31._8_4_ | (uint)!bVar8 * auVar33._8_4_;
        bVar8 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar32._12_4_ = (uint)bVar8 * auVar31._12_4_ | (uint)!bVar8 * auVar33._12_4_;
        bVar8 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar32._16_4_ = (uint)bVar8 * auVar31._16_4_ | (uint)!bVar8 * auVar33._16_4_;
        bVar8 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar32._20_4_ = (uint)bVar8 * auVar31._20_4_ | (uint)!bVar8 * auVar33._20_4_;
        bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar32._24_4_ = (uint)bVar8 * auVar31._24_4_ | (uint)!bVar8 * auVar33._24_4_;
        bVar8 = (bool)((byte)(uVar26 >> 7) & 1);
        auVar32._28_4_ = (uint)bVar8 * auVar31._28_4_ | (uint)!bVar8 * auVar33._28_4_;
        auVar32._32_4_ =
             (uint)(bVar13 & 1) * auVar31._32_4_ | (uint)!(bool)(bVar13 & 1) * auVar33._32_4_;
        bVar8 = (bool)(bVar13 >> 1 & 1);
        auVar32._36_4_ = (uint)bVar8 * auVar31._36_4_ | (uint)!bVar8 * auVar33._36_4_;
        bVar8 = (bool)(bVar13 >> 2 & 1);
        auVar32._40_4_ = (uint)bVar8 * auVar31._40_4_ | (uint)!bVar8 * auVar33._40_4_;
        bVar8 = (bool)(bVar13 >> 3 & 1);
        auVar32._44_4_ = (uint)bVar8 * auVar31._44_4_ | (uint)!bVar8 * auVar33._44_4_;
        bVar8 = (bool)(bVar13 >> 4 & 1);
        auVar32._48_4_ = (uint)bVar8 * auVar31._48_4_ | (uint)!bVar8 * auVar33._48_4_;
        bVar8 = (bool)(bVar13 >> 5 & 1);
        auVar32._52_4_ = (uint)bVar8 * auVar31._52_4_ | (uint)!bVar8 * auVar33._52_4_;
        bVar8 = (bool)(bVar13 >> 6 & 1);
        auVar32._56_4_ = (uint)bVar8 * auVar31._56_4_ | (uint)!bVar8 * auVar33._56_4_;
        auVar32._60_4_ =
             (uint)(bVar13 >> 7) * auVar31._60_4_ | (uint)!(bool)(bVar13 >> 7) * auVar33._60_4_;
        auVar28 = vextracti64x4_avx512f(auVar32,1);
        auVar31 = vpmulld_avx512f(auVar32,ZEXT3264(auVar28));
        auVar27 = vpmulld_avx(auVar31._0_16_,auVar31._16_16_);
        auVar47 = vpshufd_avx(auVar27,0xee);
        auVar27 = vpmulld_avx(auVar27,auVar47);
        auVar47 = vpshufd_avx(auVar27,0x55);
        auVar27 = vpmulld_avx(auVar27,auVar47);
        iVar44 = auVar27._0_4_;
      }
      uVar19 = (ulong)(this_00->g).d.nd;
      if (uVar19 != 0) {
        auVar31 = vpbroadcastq_avx512f();
        uVar21 = 0;
        auVar32 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar33 = vmovdqa64_avx512f(auVar32);
          auVar32 = vpbroadcastq_avx512f();
          auVar34 = vporq_avx512f(auVar32,auVar29);
          auVar32 = vporq_avx512f(auVar32,auVar30);
          uVar10 = vpcmpuq_avx512f(auVar32,auVar31,2);
          bVar12 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar34,auVar31,2);
          bVar13 = (byte)uVar10;
          uVar26 = CONCAT11(bVar13,bVar12);
          auVar32 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar21));
          auVar37._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar32._4_4_;
          auVar37._0_4_ = (uint)(bVar12 & 1) * auVar32._0_4_;
          auVar37._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar32._8_4_;
          auVar37._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar32._12_4_;
          auVar37._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar32._16_4_;
          auVar37._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar32._20_4_;
          auVar37._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar32._24_4_;
          auVar37._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar32._28_4_;
          auVar37._32_4_ = (uint)(bVar13 & 1) * auVar32._32_4_;
          auVar37._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar32._36_4_;
          auVar37._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar32._40_4_;
          auVar37._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar32._44_4_;
          auVar37._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar32._48_4_;
          auVar37._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar32._52_4_;
          auVar37._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar32._56_4_;
          auVar37._60_4_ = (uint)(bVar13 >> 7) * auVar32._60_4_;
          auVar32 = vpmulld_avx512f(auVar37,auVar33);
          uVar21 = uVar21 + 0x10;
        } while ((uVar19 + 0xf & 0x1fffffff0) != uVar21);
        auVar31 = vmovdqa32_avx512f(auVar32);
        auVar35._0_4_ =
             (uint)(bVar12 & 1) * auVar31._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar33._0_4_;
        bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar8 * auVar31._4_4_ | (uint)!bVar8 * auVar33._4_4_;
        bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar8 * auVar31._8_4_ | (uint)!bVar8 * auVar33._8_4_;
        bVar8 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar8 * auVar31._12_4_ | (uint)!bVar8 * auVar33._12_4_;
        bVar8 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar8 * auVar31._16_4_ | (uint)!bVar8 * auVar33._16_4_;
        bVar8 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar8 * auVar31._20_4_ | (uint)!bVar8 * auVar33._20_4_;
        bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar8 * auVar31._24_4_ | (uint)!bVar8 * auVar33._24_4_;
        bVar8 = (bool)((byte)(uVar26 >> 7) & 1);
        auVar35._28_4_ = (uint)bVar8 * auVar31._28_4_ | (uint)!bVar8 * auVar33._28_4_;
        auVar35._32_4_ =
             (uint)(bVar13 & 1) * auVar31._32_4_ | (uint)!(bool)(bVar13 & 1) * auVar33._32_4_;
        bVar8 = (bool)(bVar13 >> 1 & 1);
        auVar35._36_4_ = (uint)bVar8 * auVar31._36_4_ | (uint)!bVar8 * auVar33._36_4_;
        bVar8 = (bool)(bVar13 >> 2 & 1);
        auVar35._40_4_ = (uint)bVar8 * auVar31._40_4_ | (uint)!bVar8 * auVar33._40_4_;
        bVar8 = (bool)(bVar13 >> 3 & 1);
        auVar35._44_4_ = (uint)bVar8 * auVar31._44_4_ | (uint)!bVar8 * auVar33._44_4_;
        bVar8 = (bool)(bVar13 >> 4 & 1);
        auVar35._48_4_ = (uint)bVar8 * auVar31._48_4_ | (uint)!bVar8 * auVar33._48_4_;
        bVar8 = (bool)(bVar13 >> 5 & 1);
        auVar35._52_4_ = (uint)bVar8 * auVar31._52_4_ | (uint)!bVar8 * auVar33._52_4_;
        bVar8 = (bool)(bVar13 >> 6 & 1);
        auVar35._56_4_ = (uint)bVar8 * auVar31._56_4_ | (uint)!bVar8 * auVar33._56_4_;
        auVar35._60_4_ =
             (uint)(bVar13 >> 7) * auVar31._60_4_ | (uint)!(bool)(bVar13 >> 7) * auVar33._60_4_;
        auVar28 = vextracti64x4_avx512f(auVar35,1);
        auVar31 = vpmulld_avx512f(auVar35,ZEXT3264(auVar28));
        auVar27 = vpmulld_avx(auVar31._0_16_,auVar31._16_16_);
        auVar47 = vpshufd_avx(auVar27,0xee);
        auVar27 = vpmulld_avx(auVar27,auVar47);
        auVar47 = vpshufd_avx(auVar27,0x55);
        auVar27 = vpmulld_avx(auVar27,auVar47);
        iVar45 = auVar27._0_4_;
      }
      uVar14 = (this_00->values).d.bd;
      uVar17 = iVar44 * uVar14;
      if (iVar45 * (this_00->g).d.bd != uVar17) {
        pcVar18 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>]"
        ;
LAB_00278cf3:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar18);
      }
      if (uVar15 == 0) {
        iVar44 = 1;
      }
      else {
        auVar31 = vpbroadcastq_avx512f();
        uVar19 = 0;
        auVar32 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar33 = vmovdqa64_avx512f(auVar32);
          auVar32 = vpbroadcastq_avx512f();
          auVar34 = vporq_avx512f(auVar32,auVar29);
          auVar32 = vporq_avx512f(auVar32,auVar30);
          uVar10 = vpcmpuq_avx512f(auVar32,auVar31,2);
          bVar12 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar34,auVar31,2);
          bVar13 = (byte)uVar10;
          uVar26 = CONCAT11(bVar13,bVar12);
          auVar32 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar19));
          auVar36._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar32._4_4_;
          auVar36._0_4_ = (uint)(bVar12 & 1) * auVar32._0_4_;
          auVar36._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar32._8_4_;
          auVar36._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar32._12_4_;
          auVar36._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar32._16_4_;
          auVar36._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar32._20_4_;
          auVar36._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar32._24_4_;
          auVar36._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar32._28_4_;
          auVar36._32_4_ = (uint)(bVar13 & 1) * auVar32._32_4_;
          auVar36._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar32._36_4_;
          auVar36._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar32._40_4_;
          auVar36._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar32._44_4_;
          auVar36._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar32._48_4_;
          auVar36._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar32._52_4_;
          auVar36._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar32._56_4_;
          auVar36._60_4_ = (uint)(bVar13 >> 7) * auVar32._60_4_;
          auVar32 = vpmulld_avx512f(auVar36,auVar33);
          uVar19 = uVar19 + 0x10;
        } while ((uVar15 + 0xf & 0x1fffffff0) != uVar19);
        auVar29 = vmovdqa32_avx512f(auVar32);
        auVar30._0_4_ =
             (uint)(bVar12 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar33._0_4_;
        bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar30._4_4_ = (uint)bVar8 * auVar29._4_4_ | (uint)!bVar8 * auVar33._4_4_;
        bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar30._8_4_ = (uint)bVar8 * auVar29._8_4_ | (uint)!bVar8 * auVar33._8_4_;
        bVar8 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar30._12_4_ = (uint)bVar8 * auVar29._12_4_ | (uint)!bVar8 * auVar33._12_4_;
        bVar8 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar30._16_4_ = (uint)bVar8 * auVar29._16_4_ | (uint)!bVar8 * auVar33._16_4_;
        bVar8 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar30._20_4_ = (uint)bVar8 * auVar29._20_4_ | (uint)!bVar8 * auVar33._20_4_;
        bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar30._24_4_ = (uint)bVar8 * auVar29._24_4_ | (uint)!bVar8 * auVar33._24_4_;
        bVar8 = (bool)((byte)(uVar26 >> 7) & 1);
        auVar30._28_4_ = (uint)bVar8 * auVar29._28_4_ | (uint)!bVar8 * auVar33._28_4_;
        auVar30._32_4_ =
             (uint)(bVar13 & 1) * auVar29._32_4_ | (uint)!(bool)(bVar13 & 1) * auVar33._32_4_;
        bVar8 = (bool)(bVar13 >> 1 & 1);
        auVar30._36_4_ = (uint)bVar8 * auVar29._36_4_ | (uint)!bVar8 * auVar33._36_4_;
        bVar8 = (bool)(bVar13 >> 2 & 1);
        auVar30._40_4_ = (uint)bVar8 * auVar29._40_4_ | (uint)!bVar8 * auVar33._40_4_;
        bVar8 = (bool)(bVar13 >> 3 & 1);
        auVar30._44_4_ = (uint)bVar8 * auVar29._44_4_ | (uint)!bVar8 * auVar33._44_4_;
        bVar8 = (bool)(bVar13 >> 4 & 1);
        auVar30._48_4_ = (uint)bVar8 * auVar29._48_4_ | (uint)!bVar8 * auVar33._48_4_;
        bVar8 = (bool)(bVar13 >> 5 & 1);
        auVar30._52_4_ = (uint)bVar8 * auVar29._52_4_ | (uint)!bVar8 * auVar33._52_4_;
        bVar8 = (bool)(bVar13 >> 6 & 1);
        auVar30._56_4_ = (uint)bVar8 * auVar29._56_4_ | (uint)!bVar8 * auVar33._56_4_;
        auVar30._60_4_ =
             (uint)(bVar13 >> 7) * auVar29._60_4_ | (uint)!(bool)(bVar13 >> 7) * auVar33._60_4_;
        auVar28 = vextracti64x4_avx512f(auVar30,1);
        auVar29 = vpmulld_avx512f(auVar30,ZEXT3264(auVar28));
        auVar27 = vpmulld_avx(auVar29._0_16_,auVar29._16_16_);
        auVar47 = vpshufd_avx(auVar27,0xee);
        auVar27 = vpmulld_avx(auVar27,auVar47);
        auVar47 = vpshufd_avx(auVar27,0x55);
        auVar27 = vpmulld_avx(auVar27,auVar47);
        iVar44 = auVar27._0_4_;
      }
      uVar14 = iVar44 * uVar14;
      uVar15 = (ulong)uVar14;
      if (uVar14 != uVar17) {
        pcVar18 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
        ;
LAB_00278cd1:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar18);
      }
      pfVar3 = (this_00->values).v;
      uVar19 = uVar15;
      if ((((ulong)pfVar3 & 3) == 0) &&
         (uVar19 = (ulong)(-((uint)((ulong)pfVar3 >> 2) & 0x3fffffff) & 0xf), uVar15 <= uVar19)) {
        uVar19 = uVar15;
      }
      fVar1 = (this->super_Trainer).lambda;
      fVar9 = fVar43 * scale * (this->super_Trainer).eta;
      pfVar4 = (this_00->g).v;
      uVar22 = uVar15 - uVar19;
      uVar21 = uVar22 + 0xf;
      if (-1 < (long)uVar22) {
        uVar21 = uVar22;
      }
      if (uVar19 != 0) {
        auVar27._8_4_ = 0x80000000;
        auVar27._0_8_ = 0x8000000080000000;
        auVar27._12_4_ = 0x80000000;
        auVar27 = vxorps_avx512vl(ZEXT416((uint)fVar9),auVar27);
        uVar23 = 0;
        do {
          auVar47 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * pfVar3[uVar23])),auVar27,
                                    ZEXT416((uint)pfVar4[uVar23]));
          pfVar3[uVar23] = pfVar3[uVar23] + auVar47._0_4_;
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      uVar21 = (uVar21 & 0xfffffffffffffff0) + uVar19;
      if (0xf < (long)uVar22) {
        auVar47._0_4_ = -fVar9;
        auVar47._4_4_ = 0x80000000;
        auVar47._8_4_ = 0x80000000;
        auVar47._12_4_ = 0x80000000;
        auVar29 = vbroadcastss_avx512f(auVar47);
        auVar50._0_4_ = -fVar1;
        auVar50._4_4_ = 0x80000000;
        auVar50._8_4_ = 0x80000000;
        auVar50._12_4_ = 0x80000000;
        auVar30 = vbroadcastss_avx512f(auVar50);
        do {
          auVar31 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(pfVar4 + uVar19),
                                        *(undefined1 (*) [64])(pfVar3 + uVar19),auVar29);
          auVar31 = vfmadd231ps_avx512f(auVar31,auVar30,*(undefined1 (*) [64])(pfVar3 + uVar19));
          *(undefined1 (*) [64])(pfVar3 + uVar19) = auVar31;
          uVar19 = uVar19 + 0x10;
        } while ((long)uVar19 < (long)uVar21);
      }
      if ((long)uVar21 < (long)uVar15) {
        auVar11._8_4_ = 0x80000000;
        auVar11._0_8_ = 0x8000000080000000;
        auVar11._12_4_ = 0x80000000;
        auVar27 = vxorps_avx512vl(ZEXT416((uint)fVar9),auVar11);
        do {
          auVar47 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * pfVar3[uVar21])),auVar27,
                                    ZEXT416((uint)pfVar4[uVar21]));
          pfVar3[uVar21] = pfVar3[uVar21] + auVar47._0_4_;
          uVar21 = uVar21 + 1;
        } while (uVar15 != uVar21);
      }
      Parameters::clear(this_00);
      ppPVar24 = ppPVar24 + 1;
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (ppPVar24 != ppPVar2);
  }
  puVar25 = *(undefined8 **)lookup_params;
  puVar5 = *(undefined8 **)(lookup_params + 8);
  if (puVar25 != puVar5) {
    auVar29 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_01 = (LookupParameters *)*puVar25;
      for (p_Var16 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        uVar14 = *(uint *)&p_Var16[1]._M_nxt;
        pTVar6 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = (ulong)pTVar6[uVar14].d.nd;
        iVar45 = 1;
        iVar44 = 1;
        if (uVar15 != 0) {
          auVar32 = vpbroadcastq_avx512f();
          uVar19 = 0;
          auVar33 = vmovdqa64_avx512f(auVar29);
          do {
            auVar34 = vmovdqa64_avx512f(auVar33);
            auVar33 = vpbroadcastq_avx512f();
            auVar37 = vporq_avx512f(auVar33,auVar30);
            auVar33 = vporq_avx512f(auVar33,auVar31);
            uVar10 = vpcmpuq_avx512f(auVar33,auVar32,2);
            bVar12 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar37,auVar32,2);
            bVar13 = (byte)uVar10;
            uVar26 = CONCAT11(bVar13,bVar12);
            auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar6[uVar14].d.d + uVar19));
            auVar38._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar33._4_4_;
            auVar38._0_4_ = (uint)(bVar12 & 1) * auVar33._0_4_;
            auVar38._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar33._8_4_;
            auVar38._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar33._12_4_;
            auVar38._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar33._16_4_;
            auVar38._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar33._20_4_;
            auVar38._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar33._24_4_;
            auVar38._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar33._28_4_;
            auVar38._32_4_ = (uint)(bVar13 & 1) * auVar33._32_4_;
            auVar38._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar33._36_4_;
            auVar38._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar33._40_4_;
            auVar38._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar33._44_4_;
            auVar38._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar33._48_4_;
            auVar38._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar33._52_4_;
            auVar38._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar33._56_4_;
            auVar38._60_4_ = (uint)(bVar13 >> 7) * auVar33._60_4_;
            auVar33 = vpmulld_avx512f(auVar38,auVar34);
            uVar19 = uVar19 + 0x10;
          } while ((uVar15 + 0xf & 0x1fffffff0) != uVar19);
          auVar32 = vmovdqa32_avx512f(auVar33);
          auVar33._0_4_ =
               (uint)(bVar12 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar34._0_4_;
          bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar33._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar34._4_4_;
          bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar33._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar34._8_4_;
          bVar8 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar33._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar34._12_4_;
          bVar8 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar33._16_4_ = (uint)bVar8 * auVar32._16_4_ | (uint)!bVar8 * auVar34._16_4_;
          bVar8 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar33._20_4_ = (uint)bVar8 * auVar32._20_4_ | (uint)!bVar8 * auVar34._20_4_;
          bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar33._24_4_ = (uint)bVar8 * auVar32._24_4_ | (uint)!bVar8 * auVar34._24_4_;
          bVar8 = (bool)((byte)(uVar26 >> 7) & 1);
          auVar33._28_4_ = (uint)bVar8 * auVar32._28_4_ | (uint)!bVar8 * auVar34._28_4_;
          auVar33._32_4_ =
               (uint)(bVar13 & 1) * auVar32._32_4_ | (uint)!(bool)(bVar13 & 1) * auVar34._32_4_;
          bVar8 = (bool)(bVar13 >> 1 & 1);
          auVar33._36_4_ = (uint)bVar8 * auVar32._36_4_ | (uint)!bVar8 * auVar34._36_4_;
          bVar8 = (bool)(bVar13 >> 2 & 1);
          auVar33._40_4_ = (uint)bVar8 * auVar32._40_4_ | (uint)!bVar8 * auVar34._40_4_;
          bVar8 = (bool)(bVar13 >> 3 & 1);
          auVar33._44_4_ = (uint)bVar8 * auVar32._44_4_ | (uint)!bVar8 * auVar34._44_4_;
          bVar8 = (bool)(bVar13 >> 4 & 1);
          auVar33._48_4_ = (uint)bVar8 * auVar32._48_4_ | (uint)!bVar8 * auVar34._48_4_;
          bVar8 = (bool)(bVar13 >> 5 & 1);
          auVar33._52_4_ = (uint)bVar8 * auVar32._52_4_ | (uint)!bVar8 * auVar34._52_4_;
          bVar8 = (bool)(bVar13 >> 6 & 1);
          auVar33._56_4_ = (uint)bVar8 * auVar32._56_4_ | (uint)!bVar8 * auVar34._56_4_;
          auVar33._60_4_ =
               (uint)(bVar13 >> 7) * auVar32._60_4_ | (uint)!(bool)(bVar13 >> 7) * auVar34._60_4_;
          auVar28 = vextracti64x4_avx512f(auVar33,1);
          auVar32 = vpmulld_avx512f(auVar33,ZEXT3264(auVar28));
          auVar27 = vpmulld_avx(auVar32._0_16_,auVar32._16_16_);
          auVar47 = vpshufd_avx(auVar27,0xee);
          auVar27 = vpmulld_avx(auVar27,auVar47);
          auVar47 = vpshufd_avx(auVar27,0x55);
          auVar27 = vpmulld_avx(auVar27,auVar47);
          iVar44 = auVar27._0_4_;
        }
        pTVar7 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar19 = (ulong)pTVar7[uVar14].d.nd;
        if (uVar19 != 0) {
          auVar32 = vpbroadcastq_avx512f();
          uVar21 = 0;
          auVar33 = vmovdqa64_avx512f(auVar29);
          do {
            auVar34 = vmovdqa64_avx512f(auVar33);
            auVar33 = vpbroadcastq_avx512f();
            auVar37 = vporq_avx512f(auVar33,auVar30);
            auVar33 = vporq_avx512f(auVar33,auVar31);
            uVar10 = vpcmpuq_avx512f(auVar33,auVar32,2);
            bVar12 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar37,auVar32,2);
            bVar13 = (byte)uVar10;
            uVar26 = CONCAT11(bVar13,bVar12);
            auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar7[uVar14].d.d + uVar21));
            auVar39._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar33._4_4_;
            auVar39._0_4_ = (uint)(bVar12 & 1) * auVar33._0_4_;
            auVar39._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar33._8_4_;
            auVar39._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar33._12_4_;
            auVar39._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar33._16_4_;
            auVar39._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar33._20_4_;
            auVar39._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar33._24_4_;
            auVar39._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar33._28_4_;
            auVar39._32_4_ = (uint)(bVar13 & 1) * auVar33._32_4_;
            auVar39._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar33._36_4_;
            auVar39._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar33._40_4_;
            auVar39._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar33._44_4_;
            auVar39._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar33._48_4_;
            auVar39._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar33._52_4_;
            auVar39._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar33._56_4_;
            auVar39._60_4_ = (uint)(bVar13 >> 7) * auVar33._60_4_;
            auVar33 = vpmulld_avx512f(auVar39,auVar34);
            uVar21 = uVar21 + 0x10;
          } while ((uVar19 + 0xf & 0x1fffffff0) != uVar21);
          auVar32 = vmovdqa32_avx512f(auVar33);
          auVar40._0_4_ =
               (uint)(bVar12 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar34._0_4_;
          bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar40._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar34._4_4_;
          bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar40._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar34._8_4_;
          bVar8 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar40._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar34._12_4_;
          bVar8 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar40._16_4_ = (uint)bVar8 * auVar32._16_4_ | (uint)!bVar8 * auVar34._16_4_;
          bVar8 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar40._20_4_ = (uint)bVar8 * auVar32._20_4_ | (uint)!bVar8 * auVar34._20_4_;
          bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar40._24_4_ = (uint)bVar8 * auVar32._24_4_ | (uint)!bVar8 * auVar34._24_4_;
          bVar8 = (bool)((byte)(uVar26 >> 7) & 1);
          auVar40._28_4_ = (uint)bVar8 * auVar32._28_4_ | (uint)!bVar8 * auVar34._28_4_;
          auVar40._32_4_ =
               (uint)(bVar13 & 1) * auVar32._32_4_ | (uint)!(bool)(bVar13 & 1) * auVar34._32_4_;
          bVar8 = (bool)(bVar13 >> 1 & 1);
          auVar40._36_4_ = (uint)bVar8 * auVar32._36_4_ | (uint)!bVar8 * auVar34._36_4_;
          bVar8 = (bool)(bVar13 >> 2 & 1);
          auVar40._40_4_ = (uint)bVar8 * auVar32._40_4_ | (uint)!bVar8 * auVar34._40_4_;
          bVar8 = (bool)(bVar13 >> 3 & 1);
          auVar40._44_4_ = (uint)bVar8 * auVar32._44_4_ | (uint)!bVar8 * auVar34._44_4_;
          bVar8 = (bool)(bVar13 >> 4 & 1);
          auVar40._48_4_ = (uint)bVar8 * auVar32._48_4_ | (uint)!bVar8 * auVar34._48_4_;
          bVar8 = (bool)(bVar13 >> 5 & 1);
          auVar40._52_4_ = (uint)bVar8 * auVar32._52_4_ | (uint)!bVar8 * auVar34._52_4_;
          bVar8 = (bool)(bVar13 >> 6 & 1);
          auVar40._56_4_ = (uint)bVar8 * auVar32._56_4_ | (uint)!bVar8 * auVar34._56_4_;
          auVar40._60_4_ =
               (uint)(bVar13 >> 7) * auVar32._60_4_ | (uint)!(bool)(bVar13 >> 7) * auVar34._60_4_;
          auVar28 = vextracti64x4_avx512f(auVar40,1);
          auVar32 = vpmulld_avx512f(auVar40,ZEXT3264(auVar28));
          auVar27 = vpmulld_avx(auVar32._0_16_,auVar32._16_16_);
          auVar47 = vpshufd_avx(auVar27,0xee);
          auVar27 = vpmulld_avx(auVar27,auVar47);
          auVar47 = vpshufd_avx(auVar27,0x55);
          auVar27 = vpmulld_avx(auVar27,auVar47);
          iVar45 = auVar27._0_4_;
        }
        uVar17 = pTVar6[uVar14].d.bd;
        uVar20 = iVar44 * uVar17;
        if (iVar45 * pTVar7[uVar14].d.bd != uVar20) {
          pcVar18 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>]"
          ;
          goto LAB_00278cf3;
        }
        if (uVar15 == 0) {
          iVar44 = 1;
        }
        else {
          auVar32 = vpbroadcastq_avx512f();
          uVar19 = 0;
          auVar33 = vmovdqa64_avx512f(auVar29);
          do {
            auVar34 = vmovdqa64_avx512f(auVar33);
            auVar33 = vpbroadcastq_avx512f();
            auVar37 = vporq_avx512f(auVar33,auVar30);
            auVar33 = vporq_avx512f(auVar33,auVar31);
            uVar10 = vpcmpuq_avx512f(auVar33,auVar32,2);
            bVar12 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar37,auVar32,2);
            bVar13 = (byte)uVar10;
            uVar26 = CONCAT11(bVar13,bVar12);
            auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar6[uVar14].d.d + uVar19));
            auVar41._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar33._4_4_;
            auVar41._0_4_ = (uint)(bVar12 & 1) * auVar33._0_4_;
            auVar41._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar33._8_4_;
            auVar41._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar33._12_4_;
            auVar41._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar33._16_4_;
            auVar41._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar33._20_4_;
            auVar41._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar33._24_4_;
            auVar41._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar33._28_4_;
            auVar41._32_4_ = (uint)(bVar13 & 1) * auVar33._32_4_;
            auVar41._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar33._36_4_;
            auVar41._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar33._40_4_;
            auVar41._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar33._44_4_;
            auVar41._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar33._48_4_;
            auVar41._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar33._52_4_;
            auVar41._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar33._56_4_;
            auVar41._60_4_ = (uint)(bVar13 >> 7) * auVar33._60_4_;
            auVar33 = vpmulld_avx512f(auVar41,auVar34);
            uVar19 = uVar19 + 0x10;
          } while ((uVar15 + 0xf & 0x1fffffff0) != uVar19);
          auVar32 = vmovdqa32_avx512f(auVar33);
          auVar42._0_4_ =
               (uint)(bVar12 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar34._0_4_;
          bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar42._4_4_ = (uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar34._4_4_;
          bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar42._8_4_ = (uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar34._8_4_;
          bVar8 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar42._12_4_ = (uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar34._12_4_;
          bVar8 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar42._16_4_ = (uint)bVar8 * auVar32._16_4_ | (uint)!bVar8 * auVar34._16_4_;
          bVar8 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar42._20_4_ = (uint)bVar8 * auVar32._20_4_ | (uint)!bVar8 * auVar34._20_4_;
          bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar42._24_4_ = (uint)bVar8 * auVar32._24_4_ | (uint)!bVar8 * auVar34._24_4_;
          bVar8 = (bool)((byte)(uVar26 >> 7) & 1);
          auVar42._28_4_ = (uint)bVar8 * auVar32._28_4_ | (uint)!bVar8 * auVar34._28_4_;
          auVar42._32_4_ =
               (uint)(bVar13 & 1) * auVar32._32_4_ | (uint)!(bool)(bVar13 & 1) * auVar34._32_4_;
          bVar8 = (bool)(bVar13 >> 1 & 1);
          auVar42._36_4_ = (uint)bVar8 * auVar32._36_4_ | (uint)!bVar8 * auVar34._36_4_;
          bVar8 = (bool)(bVar13 >> 2 & 1);
          auVar42._40_4_ = (uint)bVar8 * auVar32._40_4_ | (uint)!bVar8 * auVar34._40_4_;
          bVar8 = (bool)(bVar13 >> 3 & 1);
          auVar42._44_4_ = (uint)bVar8 * auVar32._44_4_ | (uint)!bVar8 * auVar34._44_4_;
          bVar8 = (bool)(bVar13 >> 4 & 1);
          auVar42._48_4_ = (uint)bVar8 * auVar32._48_4_ | (uint)!bVar8 * auVar34._48_4_;
          bVar8 = (bool)(bVar13 >> 5 & 1);
          auVar42._52_4_ = (uint)bVar8 * auVar32._52_4_ | (uint)!bVar8 * auVar34._52_4_;
          bVar8 = (bool)(bVar13 >> 6 & 1);
          auVar42._56_4_ = (uint)bVar8 * auVar32._56_4_ | (uint)!bVar8 * auVar34._56_4_;
          auVar42._60_4_ =
               (uint)(bVar13 >> 7) * auVar32._60_4_ | (uint)!(bool)(bVar13 >> 7) * auVar34._60_4_;
          auVar28 = vextracti64x4_avx512f(auVar42,1);
          auVar32 = vpmulld_avx512f(auVar42,ZEXT3264(auVar28));
          auVar27 = vpmulld_avx(auVar32._0_16_,auVar32._16_16_);
          auVar47 = vpshufd_avx(auVar27,0xee);
          auVar27 = vpmulld_avx(auVar27,auVar47);
          auVar47 = vpshufd_avx(auVar27,0x55);
          auVar27 = vpmulld_avx(auVar27,auVar47);
          iVar44 = auVar27._0_4_;
        }
        uVar17 = iVar44 * uVar17;
        uVar15 = (ulong)uVar17;
        if (uVar17 != uVar20) {
          pcVar18 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
          ;
          goto LAB_00278cd1;
        }
        pfVar3 = pTVar6[uVar14].v;
        uVar19 = uVar15;
        if ((((ulong)pfVar3 & 3) == 0) &&
           (uVar19 = (ulong)(-((uint)((ulong)pfVar3 >> 2) & 0x3fffffff) & 0xf), uVar15 <= uVar19)) {
          uVar19 = uVar15;
        }
        fVar1 = (this->super_Trainer).lambda;
        pfVar4 = pTVar7[uVar14].v;
        fVar9 = fVar43 * scale * (this->super_Trainer).eta;
        uVar22 = uVar15 - uVar19;
        uVar21 = uVar22 + 0xf;
        if (-1 < (long)uVar22) {
          uVar21 = uVar22;
        }
        if (uVar19 != 0) {
          auVar48._0_4_ = -fVar9;
          auVar48._4_4_ = 0x80000000;
          auVar48._8_4_ = 0x80000000;
          auVar48._12_4_ = 0x80000000;
          uVar23 = 0;
          do {
            auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * pfVar3[uVar23])),auVar48,
                                      ZEXT416((uint)pfVar4[uVar23]));
            pfVar3[uVar23] = pfVar3[uVar23] + auVar27._0_4_;
            uVar23 = uVar23 + 1;
          } while (uVar19 != uVar23);
        }
        uVar21 = (uVar21 & 0xfffffffffffffff0) + uVar19;
        if (0xf < (long)uVar22) {
          auVar49._0_4_ = -fVar9;
          auVar49._4_4_ = 0x80000000;
          auVar49._8_4_ = 0x80000000;
          auVar49._12_4_ = 0x80000000;
          auVar32 = vbroadcastss_avx512f(auVar49);
          auVar51._0_4_ = -fVar1;
          auVar51._4_4_ = 0x80000000;
          auVar51._8_4_ = 0x80000000;
          auVar51._12_4_ = 0x80000000;
          auVar33 = vbroadcastss_avx512f(auVar51);
          do {
            auVar34 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(pfVar4 + uVar19),
                                          *(undefined1 (*) [64])(pfVar3 + uVar19),auVar32);
            auVar34 = vfmadd231ps_avx512f(auVar34,auVar33,*(undefined1 (*) [64])(pfVar3 + uVar19));
            *(undefined1 (*) [64])(pfVar3 + uVar19) = auVar34;
            uVar19 = uVar19 + 0x10;
          } while ((long)uVar19 < (long)uVar21);
        }
        if ((long)uVar21 < (long)uVar15) {
          auVar46._0_4_ = -fVar9;
          auVar46._4_4_ = 0x80000000;
          auVar46._8_4_ = 0x80000000;
          auVar46._12_4_ = 0x80000000;
          do {
            auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * pfVar3[uVar21])),auVar46,
                                      ZEXT416((uint)pfVar4[uVar21]));
            pfVar3[uVar21] = pfVar3[uVar21] + auVar27._0_4_;
            uVar21 = uVar21 + 1;
          } while (uVar15 != uVar21);
        }
      }
      LookupParameters::clear(this_01);
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar29 = vpbroadcastd_avx512f(ZEXT416(1));
      puVar25 = puVar25 + 1;
    } while (puVar25 != puVar5);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
}

Assistant:

void SimpleSGDTrainer::update(const std::vector<LookupParameters*> &lookup_params, const std::vector<Parameters*> &params, real scale) {
  const float gscale = clip_gradients();
  for (auto p : params) {
#if HAVE_CUDA
    gpu::sgd_update(p->values.d.size(), p->g.v, p->values.v, eta * scale * gscale, lambda);
#else
    auto reg = (p->values.vec()) * lambda;
    p->values.vec() -= ((eta * scale * gscale) * p->g.vec() + reg);
#endif
    p->clear();
  }
  for (auto p : lookup_params) {
    for (auto i : p->non_zero_grads) {
#if HAVE_CUDA
      gpu::sgd_update(p->values[i].d.size(), p->grads[i].v, p->values[i].v, eta * scale * gscale, lambda);
#else
      auto reg = (p->values[i].vec()) * lambda;
      p->values[i].vec() -= (p->grads[i].vec() * (eta * scale * gscale) + reg);
#endif
    }
    p->clear();
  }
  ++updates;
}